

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_ref_t art_insert_at(art_t *art,art_ref_t ref,art_key_chunk_t *key,uint8_t depth,
                       art_ref_t new_leaf)

{
  byte *pbVar1;
  art_node_t *paVar2;
  byte bVar3;
  byte prefix_size;
  art_inner_node_t *node;
  ulong uVar4;
  art_ref_t new_child;
  art_ref_t aVar5;
  art_key_chunk_t key_chunk;
  art_key_chunk_t *paVar6;
  byte *key1;
  uint8_t in_R9B;
  ulong uVar7;
  long lVar8;
  long lVar9;
  art_typecode_t typecode;
  art_typecode_t typecode_2;
  
  uVar7 = ref & 0xff;
  if (uVar7 == 1) {
    paVar6 = (art_key_chunk_t *)((ref >> 0xc & 0xfffffffffffffff0) + (long)art->nodes[1]);
    bVar3 = art_common_prefix(paVar6,depth,'\x06',key,depth,in_R9B);
    node = (art_inner_node_t *)art_node4_create(art,key + depth,bVar3);
    lVar8 = (ulong)bVar3 + (ulong)depth;
    art_node4_insert(art,(art_node4_t *)node,ref,paVar6[lVar8]);
    key_chunk = key[lVar8];
  }
  else {
    uVar4 = (ulong)(uint)((int)uVar7 * 8);
    lVar8 = *(long *)((long)art->nodes + uVar4);
    lVar9 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar4);
    pbVar1 = (byte *)(lVar8 + lVar9);
    key1 = pbVar1 + 1;
    bVar3 = *pbVar1;
    prefix_size = art_common_prefix(key1,'\0',bVar3,key,depth,in_R9B);
    uVar4 = (ulong)prefix_size;
    if (prefix_size == bVar3) {
      node = (art_inner_node_t *)(lVar8 + lVar9);
      lVar8 = depth + uVar4;
      key_chunk = key[lVar8];
      aVar5 = art_find_child(node,(art_typecode_t)ref,key_chunk);
      if (aVar5 == 0) {
        switch((uint)ref & 0xff) {
        case 2:
          goto LAB_0010643d;
        case 3:
          aVar5 = art_node16_insert(art,(art_node16_t *)node,new_leaf,key_chunk);
          return aVar5;
        case 4:
          aVar5 = art_node48_insert(art,(art_node48_t *)node,new_leaf,key_chunk);
          return aVar5;
        case 5:
          aVar5 = art_node256_insert(art,(art_node256_t *)node,new_leaf,key_chunk);
          return aVar5;
        default:
          ref = 0;
        }
      }
      else {
        new_child = art_insert_at(art,aVar5,key,(char)lVar8 + '\x01',new_leaf);
        if (new_child != aVar5) {
          art_replace((art_inner_node_t *)(lVar9 + (long)art->nodes[uVar7]),(art_typecode_t)ref,
                      key_chunk,new_child);
        }
      }
      return ref;
    }
    paVar6 = (art_key_chunk_t *)roaring_malloc(uVar4);
    memcpy(paVar6,key1,uVar4);
    node = (art_inner_node_t *)art_node4_create(art,paVar6,prefix_size);
    roaring_free(paVar6);
    art_node4_insert(art,(art_node4_t *)node,ref,
                     *(uint8_t *)((long)art->nodes[uVar7] + uVar4 + 1 + lVar9));
    paVar2 = art->nodes[uVar7];
    bVar3 = ~prefix_size + *(char *)((long)paVar2 + lVar9);
    *(byte *)((long)paVar2 + lVar9) = bVar3;
    if (bVar3 != 0) {
      memmove((void *)((long)paVar2 + lVar9 + 1),(void *)((long)paVar2 + uVar4 + lVar9 + 2),
              (ulong)bVar3);
    }
    key_chunk = key[depth + uVar4];
  }
LAB_0010643d:
  aVar5 = art_node4_insert(art,(art_node4_t *)node,new_leaf,key_chunk);
  return aVar5;
}

Assistant:

static art_ref_t art_insert_at(art_t *art, art_ref_t ref,
                               const art_key_chunk_t key[], uint8_t depth,
                               art_ref_t new_leaf) {
    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        uint8_t common_prefix = art_common_prefix(
            leaf->key, depth, ART_KEY_BYTES, key, depth, ART_KEY_BYTES);

        // Previously this was a leaf, create an inner node instead and add
        // both the existing and new leaf to it.
        art_node_t *new_node =
            (art_node_t *)art_node4_create(art, key + depth, common_prefix);

        art_ref_t new_ref = art_node_insert_leaf(
            art, (art_inner_node_t *)new_node, CROARING_ART_NODE4_TYPE,
            leaf->key[depth + common_prefix], ref);
        new_ref = art_node_insert_leaf(art, (art_inner_node_t *)new_node,
                                       CROARING_ART_NODE4_TYPE,
                                       key[depth + common_prefix], new_leaf);

        // The new inner node is now the rootmost node.
        return new_ref;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);
    // Not a leaf: inner node
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Partial prefix match. Create a new internal node to hold the common
        // prefix.
        // We create a copy of the node's prefix as the creation of a new
        // node may invalidate the prefix pointer.
        art_key_chunk_t *prefix_copy = (art_key_chunk_t *)roaring_malloc(
            common_prefix * sizeof(art_key_chunk_t));
        memcpy(prefix_copy, inner_node->prefix,
               common_prefix * sizeof(art_key_chunk_t));
        art_node4_t *node4 = art_node4_create(art, prefix_copy, common_prefix);
        roaring_free(prefix_copy);

        // Deref as a new node was created.
        inner_node = (art_inner_node_t *)art_deref(art, ref);

        // Make the existing internal node a child of the new internal node.
        art_node4_insert(art, node4, ref, inner_node->prefix[common_prefix]);

        // Deref again as a new node was created.
        inner_node = (art_inner_node_t *)art_deref(art, ref);

        // Correct the prefix of the moved internal node, trimming off the
        // chunk inserted into the new internal node.
        inner_node->prefix_size = inner_node->prefix_size - common_prefix - 1;
        if (inner_node->prefix_size > 0) {
            // Move the remaining prefix to the correct position.
            memmove(inner_node->prefix, inner_node->prefix + common_prefix + 1,
                    inner_node->prefix_size);
        }

        // Insert the value in the new internal node.
        return art_node_insert_leaf(art, (art_inner_node_t *)node4,
                                    CROARING_ART_NODE4_TYPE,
                                    key[common_prefix + depth], new_leaf);
    }
    // Prefix matches entirely or node has no prefix. Look for an existing
    // child.
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_ref_t child =
        art_find_child(inner_node, art_ref_typecode(ref), key_chunk);
    if (child != CROARING_ART_NULL_REF) {
        art_ref_t new_child =
            art_insert_at(art, child, key, depth + common_prefix + 1, new_leaf);
        if (new_child != child) {
            // Deref again as a new node may have been created.
            inner_node = (art_inner_node_t *)art_deref(art, ref);
            // Node type changed.
            art_replace(inner_node, art_ref_typecode(ref), key_chunk,
                        new_child);
        }
        return ref;
    }
    return art_node_insert_leaf(art, inner_node, art_ref_typecode(ref),
                                key_chunk, new_leaf);
}